

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
fmt::v5::to_string<char,500ul>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,v5 *this,basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf)

{
  char *pcVar1;
  size_t sVar2;
  allocator local_19;
  basic_buffer<char> *local_18;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf_local;
  
  local_18 = (basic_buffer<char> *)this;
  buf_local = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)__return_storage_ptr__;
  pcVar1 = internal::basic_buffer<char>::data((basic_buffer<char> *)this);
  sVar2 = internal::basic_buffer<char>::size(local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,sVar2,&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<Char> to_string(const basic_memory_buffer<Char, SIZE> &buf) {
  return std::basic_string<Char>(buf.data(), buf.size());
}